

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parser.h
# Opt level: O0

void __thiscall mjs::conditional_expression::~conditional_expression(conditional_expression *this)

{
  conditional_expression *this_local;
  
  (this->super_expression).super_syntax_node._vptr_syntax_node =
       (_func_int **)&PTR__conditional_expression_0029b210;
  std::unique_ptr<mjs::expression,_std::default_delete<mjs::expression>_>::~unique_ptr(&this->rhs_);
  std::unique_ptr<mjs::expression,_std::default_delete<mjs::expression>_>::~unique_ptr(&this->lhs_);
  std::unique_ptr<mjs::expression,_std::default_delete<mjs::expression>_>::~unique_ptr(&this->cond_)
  ;
  expression::~expression(&this->super_expression);
  return;
}

Assistant:

explicit conditional_expression(const source_extend& extend, expression_ptr&& cond, expression_ptr&& lhs, expression_ptr&& rhs) : expression(extend), cond_(std::move(cond)), lhs_(std::move(lhs)), rhs_(std::move(rhs)) {
        assert(lhs_);
        assert(rhs_);
    }